

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O2

void Eigen::internal::
     general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_1,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_false,_0>
     ::run(long rows,long cols,const_blas_data_mapper<float,_long,_1> *alhs,
          const_blas_data_mapper<float,_long,_0> *rhs,ResScalar *res,long resIncr,ResScalar alpha)

{
  float *pfVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  ulong uVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  long lVar16;
  float *pfVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  
  pfVar14 = (alhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data;
  lVar2 = (alhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride;
  pfVar8 = pfVar14 + lVar2;
  pfVar10 = pfVar14 + lVar2 * 3;
  pfVar9 = pfVar14 + lVar2 * 2;
  for (uVar12 = 0; ((ulong)(lVar2 * 4) < 0x7d01 && ((long)uVar12 < rows + -7)); uVar12 = uVar12 + 8)
  {
    pfVar15 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
    fVar26 = 0.0;
    fVar27 = 0.0;
    fVar28 = 0.0;
    fVar29 = 0.0;
    fVar30 = 0.0;
    fVar31 = 0.0;
    fVar32 = 0.0;
    fVar33 = 0.0;
    fVar34 = 0.0;
    fVar35 = 0.0;
    fVar36 = 0.0;
    fVar37 = 0.0;
    fVar18 = 0.0;
    fVar19 = 0.0;
    fVar20 = 0.0;
    fVar21 = 0.0;
    fVar38 = 0.0;
    fVar39 = 0.0;
    fVar40 = 0.0;
    fVar41 = 0.0;
    fVar42 = 0.0;
    fVar43 = 0.0;
    fVar44 = 0.0;
    fVar45 = 0.0;
    fVar46 = 0.0;
    fVar47 = 0.0;
    fVar48 = 0.0;
    fVar49 = 0.0;
    fVar22 = 0.0;
    fVar23 = 0.0;
    fVar24 = 0.0;
    fVar25 = 0.0;
    pfVar7 = pfVar14;
    lVar16 = 0;
    while (lVar16 + 4 <= cols) {
      pfVar11 = pfVar15 + lVar16;
      fVar3 = *pfVar11;
      fVar4 = pfVar11[1];
      fVar5 = pfVar11[2];
      fVar6 = pfVar11[3];
      pfVar11 = pfVar14 + lVar16;
      fVar22 = fVar22 + *pfVar11 * fVar3;
      fVar23 = fVar23 + pfVar11[1] * fVar4;
      fVar24 = fVar24 + pfVar11[2] * fVar5;
      fVar25 = fVar25 + pfVar11[3] * fVar6;
      pfVar11 = pfVar14 + lVar16 + lVar2;
      fVar46 = fVar46 + *pfVar11 * fVar3;
      fVar47 = fVar47 + pfVar11[1] * fVar4;
      fVar48 = fVar48 + pfVar11[2] * fVar5;
      fVar49 = fVar49 + pfVar11[3] * fVar6;
      pfVar11 = pfVar14 + lVar16 + lVar2 * 2;
      fVar42 = fVar42 + *pfVar11 * fVar3;
      fVar43 = fVar43 + pfVar11[1] * fVar4;
      fVar44 = fVar44 + pfVar11[2] * fVar5;
      fVar45 = fVar45 + pfVar11[3] * fVar6;
      pfVar11 = pfVar14 + lVar16 + lVar2 * 3;
      fVar38 = fVar38 + *pfVar11 * fVar3;
      fVar39 = fVar39 + pfVar11[1] * fVar4;
      fVar40 = fVar40 + pfVar11[2] * fVar5;
      fVar41 = fVar41 + pfVar11[3] * fVar6;
      pfVar11 = pfVar14 + lVar16 + lVar2 * 4;
      fVar18 = fVar18 + *pfVar11 * fVar3;
      fVar19 = fVar19 + pfVar11[1] * fVar4;
      fVar20 = fVar20 + pfVar11[2] * fVar5;
      fVar21 = fVar21 + pfVar11[3] * fVar6;
      pfVar11 = pfVar14 + lVar16 + lVar2 * 5;
      fVar34 = fVar34 + *pfVar11 * fVar3;
      fVar35 = fVar35 + pfVar11[1] * fVar4;
      fVar36 = fVar36 + pfVar11[2] * fVar5;
      fVar37 = fVar37 + pfVar11[3] * fVar6;
      pfVar11 = pfVar14 + lVar16 + lVar2 * 6;
      pfVar13 = pfVar14 + lVar16 + lVar2 * 7;
      fVar30 = fVar30 + *pfVar11 * fVar3;
      fVar31 = fVar31 + pfVar11[1] * fVar4;
      fVar32 = fVar32 + pfVar11[2] * fVar5;
      fVar33 = fVar33 + pfVar11[3] * fVar6;
      fVar26 = fVar26 + *pfVar13 * fVar3;
      fVar27 = fVar27 + pfVar13[1] * fVar4;
      fVar28 = fVar28 + pfVar13[2] * fVar5;
      fVar29 = fVar29 + pfVar13[3] * fVar6;
      pfVar7 = pfVar7 + 4;
      lVar16 = lVar16 + 4;
    }
    fVar22 = fVar25 + fVar23 + fVar24 + fVar22;
    fVar23 = fVar49 + fVar47 + fVar48 + fVar46;
    fVar24 = fVar45 + fVar43 + fVar44 + fVar42;
    fVar25 = fVar41 + fVar39 + fVar40 + fVar38;
    fVar18 = fVar21 + fVar19 + fVar20 + fVar18;
    fVar19 = fVar37 + fVar35 + fVar36 + fVar34;
    fVar20 = fVar33 + fVar31 + fVar32 + fVar30;
    fVar21 = fVar29 + fVar27 + fVar28 + fVar26;
    for (; lVar16 < cols; lVar16 = lVar16 + 1) {
      fVar26 = pfVar15[lVar16];
      fVar18 = fVar18 + pfVar7[lVar2 * 4] * fVar26;
      fVar19 = fVar19 + pfVar7[lVar2 * 5] * fVar26;
      fVar20 = fVar20 + pfVar7[lVar2 * 6] * fVar26;
      fVar21 = fVar21 + pfVar7[lVar2 * 7] * fVar26;
      fVar22 = fVar22 + *pfVar7 * fVar26;
      fVar23 = fVar23 + pfVar7[lVar2] * fVar26;
      fVar24 = fVar24 + pfVar7[lVar2 * 2] * fVar26;
      fVar25 = fVar25 + pfVar7[lVar2 * 3] * fVar26;
      pfVar7 = pfVar7 + 1;
    }
    res[uVar12 * resIncr] = alpha * fVar22 + res[uVar12 * resIncr];
    lVar16 = (uVar12 | 1) * resIncr;
    res[lVar16] = fVar23 * alpha + res[lVar16];
    lVar16 = (uVar12 | 2) * resIncr;
    res[lVar16] = fVar24 * alpha + res[lVar16];
    lVar16 = (uVar12 | 3) * resIncr;
    res[lVar16] = fVar25 * alpha + res[lVar16];
    lVar16 = (uVar12 | 4) * resIncr;
    res[lVar16] = alpha * fVar18 + res[lVar16];
    lVar16 = (uVar12 | 5) * resIncr;
    res[lVar16] = fVar19 * alpha + res[lVar16];
    lVar16 = (uVar12 | 6) * resIncr;
    res[lVar16] = fVar20 * alpha + res[lVar16];
    lVar16 = (uVar12 | 7) * resIncr;
    res[lVar16] = fVar21 * alpha + res[lVar16];
    pfVar14 = pfVar14 + lVar2 * 8;
    pfVar8 = pfVar8 + lVar2 * 8;
    pfVar10 = pfVar10 + lVar2 * 8;
    pfVar9 = pfVar9 + lVar2 * 8;
  }
  for (; (long)uVar12 < rows + -3; uVar12 = uVar12 + 4) {
    pfVar15 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
    fVar22 = 0.0;
    fVar23 = 0.0;
    fVar24 = 0.0;
    fVar25 = 0.0;
    fVar26 = 0.0;
    fVar27 = 0.0;
    fVar28 = 0.0;
    fVar29 = 0.0;
    fVar30 = 0.0;
    fVar31 = 0.0;
    fVar32 = 0.0;
    fVar33 = 0.0;
    fVar18 = 0.0;
    fVar19 = 0.0;
    fVar20 = 0.0;
    fVar21 = 0.0;
    lVar16 = 0;
    pfVar7 = pfVar8;
    pfVar11 = pfVar9;
    pfVar13 = pfVar14;
    pfVar17 = pfVar10;
    while (lVar16 + 4 <= cols) {
      pfVar1 = pfVar15 + lVar16;
      fVar34 = *pfVar1;
      fVar35 = pfVar1[1];
      fVar36 = pfVar1[2];
      fVar37 = pfVar1[3];
      pfVar1 = pfVar14 + lVar16;
      fVar18 = fVar18 + *pfVar1 * fVar34;
      fVar19 = fVar19 + pfVar1[1] * fVar35;
      fVar20 = fVar20 + pfVar1[2] * fVar36;
      fVar21 = fVar21 + pfVar1[3] * fVar37;
      pfVar1 = pfVar8 + lVar16;
      fVar30 = fVar30 + *pfVar1 * fVar34;
      fVar31 = fVar31 + pfVar1[1] * fVar35;
      fVar32 = fVar32 + pfVar1[2] * fVar36;
      fVar33 = fVar33 + pfVar1[3] * fVar37;
      pfVar1 = pfVar9 + lVar16;
      fVar26 = fVar26 + *pfVar1 * fVar34;
      fVar27 = fVar27 + pfVar1[1] * fVar35;
      fVar28 = fVar28 + pfVar1[2] * fVar36;
      fVar29 = fVar29 + pfVar1[3] * fVar37;
      pfVar1 = pfVar10 + lVar16;
      fVar22 = fVar22 + *pfVar1 * fVar34;
      fVar23 = fVar23 + pfVar1[1] * fVar35;
      fVar24 = fVar24 + pfVar1[2] * fVar36;
      fVar25 = fVar25 + pfVar1[3] * fVar37;
      pfVar13 = pfVar13 + 4;
      pfVar7 = pfVar7 + 4;
      pfVar11 = pfVar11 + 4;
      pfVar17 = pfVar17 + 4;
      lVar16 = lVar16 + 4;
    }
    fVar18 = fVar21 + fVar19 + fVar20 + fVar18;
    fVar19 = fVar33 + fVar31 + fVar32 + fVar30;
    fVar20 = fVar29 + fVar27 + fVar28 + fVar26;
    fVar21 = fVar25 + fVar23 + fVar24 + fVar22;
    for (; lVar16 < cols; lVar16 = lVar16 + 1) {
      fVar22 = pfVar15[lVar16];
      fVar18 = fVar18 + *pfVar13 * fVar22;
      fVar19 = fVar19 + *pfVar7 * fVar22;
      fVar20 = fVar20 + *pfVar11 * fVar22;
      fVar21 = fVar21 + *pfVar17 * fVar22;
      pfVar13 = pfVar13 + 1;
      pfVar7 = pfVar7 + 1;
      pfVar11 = pfVar11 + 1;
      pfVar17 = pfVar17 + 1;
    }
    res[uVar12 * resIncr] = alpha * fVar18 + res[uVar12 * resIncr];
    lVar16 = (uVar12 | 1) * resIncr;
    res[lVar16] = fVar19 * alpha + res[lVar16];
    lVar16 = (uVar12 | 2) * resIncr;
    res[lVar16] = fVar20 * alpha + res[lVar16];
    lVar16 = (uVar12 | 3) * resIncr;
    res[lVar16] = fVar21 * alpha + res[lVar16];
    pfVar14 = pfVar14 + lVar2 * 4;
    pfVar8 = pfVar8 + lVar2 * 4;
    pfVar10 = pfVar10 + lVar2 * 4;
    pfVar9 = pfVar9 + lVar2 * 4;
  }
  for (; (long)uVar12 < rows + -1; uVar12 = uVar12 + 2) {
    pfVar9 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
    fVar18 = 0.0;
    fVar19 = 0.0;
    fVar20 = 0.0;
    fVar21 = 0.0;
    fVar22 = 0.0;
    fVar23 = 0.0;
    fVar24 = 0.0;
    fVar25 = 0.0;
    pfVar10 = pfVar14;
    pfVar15 = pfVar8;
    lVar16 = 0;
    while (lVar16 + 4 <= cols) {
      pfVar7 = pfVar9 + lVar16;
      pfVar11 = pfVar14 + lVar16;
      fVar18 = fVar18 + *pfVar11 * *pfVar7;
      fVar19 = fVar19 + pfVar11[1] * pfVar7[1];
      fVar20 = fVar20 + pfVar11[2] * pfVar7[2];
      fVar21 = fVar21 + pfVar11[3] * pfVar7[3];
      pfVar11 = pfVar8 + lVar16;
      fVar22 = fVar22 + *pfVar11 * *pfVar7;
      fVar23 = fVar23 + pfVar11[1] * pfVar7[1];
      fVar24 = fVar24 + pfVar11[2] * pfVar7[2];
      fVar25 = fVar25 + pfVar11[3] * pfVar7[3];
      pfVar10 = pfVar10 + 4;
      pfVar15 = pfVar15 + 4;
      lVar16 = lVar16 + 4;
    }
    fVar18 = fVar21 + fVar19 + fVar20 + fVar18;
    fVar19 = fVar25 + fVar23 + fVar24 + fVar22;
    for (; lVar16 < cols; lVar16 = lVar16 + 1) {
      fVar20 = pfVar9[lVar16];
      fVar18 = fVar18 + *pfVar10 * fVar20;
      fVar19 = fVar19 + *pfVar15 * fVar20;
      pfVar10 = pfVar10 + 1;
      pfVar15 = pfVar15 + 1;
    }
    res[uVar12 * resIncr] = alpha * fVar18 + res[uVar12 * resIncr];
    lVar16 = (uVar12 | 1) * resIncr;
    res[lVar16] = fVar19 * alpha + res[lVar16];
    pfVar14 = pfVar14 + lVar2 * 2;
    pfVar8 = pfVar8 + lVar2 * 2;
  }
  for (; (long)uVar12 < rows; uVar12 = uVar12 + 1) {
    pfVar8 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
    fVar18 = 0.0;
    fVar19 = 0.0;
    fVar20 = 0.0;
    fVar21 = 0.0;
    pfVar9 = pfVar14;
    lVar16 = 0;
    while (lVar16 + 4 <= cols) {
      pfVar10 = pfVar8 + lVar16;
      pfVar15 = pfVar14 + lVar16;
      fVar18 = fVar18 + *pfVar15 * *pfVar10;
      fVar19 = fVar19 + pfVar15[1] * pfVar10[1];
      fVar20 = fVar20 + pfVar15[2] * pfVar10[2];
      fVar21 = fVar21 + pfVar15[3] * pfVar10[3];
      pfVar9 = pfVar9 + 4;
      lVar16 = lVar16 + 4;
    }
    fVar18 = fVar21 + fVar19 + fVar20 + fVar18;
    for (; lVar16 < cols; lVar16 = lVar16 + 1) {
      fVar18 = fVar18 + *pfVar9 * pfVar8[lVar16];
      pfVar9 = pfVar9 + 1;
    }
    res[uVar12 * resIncr] = fVar18 * alpha + res[uVar12 * resIncr];
    pfVar14 = pfVar14 + lVar2;
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,RowMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& alhs,
  const RhsMapper& rhs,
  ResScalar* res, Index resIncr,
  ResScalar alpha)
{
  // The following copy tells the compiler that lhs's attributes are not modified outside this function
  // This helps GCC to generate propoer code.
  LhsMapper lhs(alhs);

  eigen_internal_assert(rhs.stride()==1);
  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;
  conj_helper<LhsPacketHalf,RhsPacketHalf,ConjugateLhs,ConjugateRhs> pcj_half;
  conj_helper<LhsPacketQuarter,RhsPacketQuarter,ConjugateLhs,ConjugateRhs> pcj_quarter;

  // TODO: fine tune the following heuristic. The rationale is that if the matrix is very large,
  //       processing 8 rows at once might be counter productive wrt cache.
  const Index n8 = lhs.stride()*sizeof(LhsScalar)>32000 ? 0 : rows-7;
  const Index n4 = rows-3;
  const Index n2 = rows-1;

  // TODO: for padded aligned inputs, we could enable aligned reads
  enum { LhsAlignment = Unaligned,
         ResPacketSize = Traits::ResPacketSize,
         ResPacketSizeHalf = HalfTraits::ResPacketSize,
         ResPacketSizeQuarter = QuarterTraits::ResPacketSize,
         LhsPacketSize = Traits::LhsPacketSize,
         LhsPacketSizeHalf = HalfTraits::LhsPacketSize,
         LhsPacketSizeQuarter = QuarterTraits::LhsPacketSize,
         HasHalf = (int)ResPacketSizeHalf < (int)ResPacketSize,
         HasQuarter = (int)ResPacketSizeQuarter < (int)ResPacketSizeHalf
  };

  Index i=0;
  for(; i<n8; i+=8)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0)),
              c4 = pset1<ResPacket>(ResScalar(0)),
              c5 = pset1<ResPacket>(ResScalar(0)),
              c6 = pset1<ResPacket>(ResScalar(0)),
              c7 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
      c4 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+4,j),b0,c4);
      c5 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+5,j),b0,c5);
      c6 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+6,j),b0,c6);
      c7 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+7,j),b0,c7);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    ResScalar cc4 = predux(c4);
    ResScalar cc5 = predux(c5);
    ResScalar cc6 = predux(c6);
    ResScalar cc7 = predux(c7);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
      cc4 += cj.pmul(lhs(i+4,j), b0);
      cc5 += cj.pmul(lhs(i+5,j), b0);
      cc6 += cj.pmul(lhs(i+6,j), b0);
      cc7 += cj.pmul(lhs(i+7,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
    res[(i+4)*resIncr] += alpha*cc4;
    res[(i+5)*resIncr] += alpha*cc5;
    res[(i+6)*resIncr] += alpha*cc6;
    res[(i+7)*resIncr] += alpha*cc7;
  }
  for(; i<n4; i+=4)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
  }
  for(; i<n2; i+=2)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
  }
  for(; i<rows; ++i)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0));
    ResPacketHalf c0_h = pset1<ResPacketHalf>(ResScalar(0));
    ResPacketQuarter c0_q = pset1<ResPacketQuarter>(ResScalar(0));
    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket,Unaligned>(j,0);
      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i,j),b0,c0);
    }
    ResScalar cc0 = predux(c0);
    if (HasHalf) {
      for(; j+LhsPacketSizeHalf<=cols; j+=LhsPacketSizeHalf)
        {
          RhsPacketHalf b0 = rhs.template load<RhsPacketHalf,Unaligned>(j,0);
          c0_h = pcj_half.pmadd(lhs.template load<LhsPacketHalf,LhsAlignment>(i,j),b0,c0_h);
        }
      cc0 += predux(c0_h);
    }
    if (HasQuarter) {
      for(; j+LhsPacketSizeQuarter<=cols; j+=LhsPacketSizeQuarter)
        {
          RhsPacketQuarter b0 = rhs.template load<RhsPacketQuarter,Unaligned>(j,0);
          c0_q = pcj_quarter.pmadd(lhs.template load<LhsPacketQuarter,LhsAlignment>(i,j),b0,c0_q);
        }
      cc0 += predux(c0_q);
    }
    for(; j<cols; ++j)
    {
      cc0 += cj.pmul(lhs(i,j), rhs(j,0));
    }
    res[i*resIncr] += alpha*cc0;
  }
}